

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O0

int is_shorter_gf_interval_better(AV1_COMP *cpi,EncodeFrameParams *frame_params)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  AV1_COMP *cpi_00;
  long *in_RDI;
  int gop_length_eval;
  int is_temporal_filter_enabled;
  GF_GROUP *gf_group;
  int do_complete_tpl;
  int shorten_gf_interval;
  int gop_length_decision_method;
  PRIMARY_RATE_CONTROL *p_rc;
  RATE_CONTROL *rc;
  EncodeFrameParams *in_stack_00000098;
  int in_stack_000000a4;
  AV1_COMP *in_stack_000000a8;
  byte local_41;
  uint in_stack_ffffffffffffffd8;
  
  cpi_00 = (AV1_COMP *)(*in_RDI + 0x8b30);
  iVar3 = *(int *)((long)in_RDI + 0x60904);
  av1_tpl_preload_rc_estimate(cpi_00,(EncodeFrameParams *)CONCAT44(iVar3,in_stack_ffffffffffffffd8))
  ;
  if (iVar3 == 2) {
    local_41 = 0;
    if ((double)*(int *)&cpi_00->field_0xc <
        (double)(*(int *)((cpi_00->enc_quant_dequant_params).quants.y_zbin[0x15] + 4) * 0x32) * 1.4)
    {
      iVar3 = av1_tpl_setup_stats(in_stack_000000a8,in_stack_000000a4,in_stack_00000098);
      local_41 = iVar3 != 0 ^ 0xff;
    }
    in_stack_ffffffffffffffd8 = (uint)(local_41 & 1);
  }
  else {
    bVar2 = true;
    bVar1 = false;
    if (0 < (int)in_RDI[0xc0f4]) {
      bVar1 = *(uint *)(*in_RDI + 0x1a04) < 0x80000000;
    }
    if (iVar3 == 1) {
      iVar3 = av1_tpl_setup_stats(in_stack_000000a8,in_stack_000000a4,in_stack_00000098);
      if (iVar3 != 2) {
        in_stack_ffffffffffffffd8 = (uint)((iVar3 != 0 ^ 0xffU) & 1);
      }
      bVar2 = iVar3 == 2;
    }
    if (bVar2) {
      iVar3 = av1_tpl_setup_stats(in_stack_000000a8,in_stack_000000a4,in_stack_00000098);
      in_stack_ffffffffffffffd8 = (uint)((iVar3 != 0 ^ 0xffU) & 1);
      if ((bVar1) && (in_stack_ffffffffffffffd8 == 0)) {
        *(undefined4 *)(in_RDI + 0x8548) = 1;
      }
    }
  }
  return in_stack_ffffffffffffffd8;
}

Assistant:

static int is_shorter_gf_interval_better(
    AV1_COMP *cpi, const EncodeFrameParams *frame_params) {
  const RATE_CONTROL *const rc = &cpi->rc;
  PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;
  int gop_length_decision_method = cpi->sf.tpl_sf.gop_length_decision_method;
  int shorten_gf_interval;

  av1_tpl_preload_rc_estimate(cpi, frame_params);

  if (gop_length_decision_method == 2) {
    // GF group length is decided based on GF boost and tpl stats of ARFs from
    // base layer, (base+1) layer.
    shorten_gf_interval =
        (p_rc->gfu_boost <
         p_rc->num_stats_used_for_gfu_boost * GF_MIN_BOOST * 1.4) &&
        !av1_tpl_setup_stats(cpi, 3, frame_params);
  } else {
    int do_complete_tpl = 1;
    GF_GROUP *const gf_group = &cpi->ppi->gf_group;
    int is_temporal_filter_enabled =
        (rc->frames_since_key > 0 && gf_group->arf_index > -1);

    if (gop_length_decision_method == 1) {
      // Check if tpl stats of ARFs from base layer, (base+1) layer,
      // (base+2) layer can decide the GF group length.
      int gop_length_eval = av1_tpl_setup_stats(cpi, 2, frame_params);

      if (gop_length_eval != 2) {
        do_complete_tpl = 0;
        shorten_gf_interval = !gop_length_eval;
      }
    }

    if (do_complete_tpl) {
      // Decide GF group length based on complete tpl stats.
      shorten_gf_interval = !av1_tpl_setup_stats(cpi, 1, frame_params);
      // Tpl stats is reused when the ARF is temporally filtered and GF
      // interval is not shortened.
      if (is_temporal_filter_enabled && !shorten_gf_interval) {
        cpi->skip_tpl_setup_stats = 1;
#if CONFIG_BITRATE_ACCURACY && !CONFIG_THREE_PASS
        assert(cpi->gf_frame_index == 0);
        av1_vbr_rc_update_q_index_list(&cpi->vbr_rc_info, &cpi->ppi->tpl_data,
                                       gf_group,
                                       cpi->common.seq_params->bit_depth);
#endif  // CONFIG_BITRATE_ACCURACY
      }
    }
  }
  return shorten_gf_interval;
}